

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling_sse2.c
# Opt level: O1

void WebPInitUpsamplersSSE2(void)

{
  WebPUpsamplers[1] = UpsampleRgbaLinePair_SSE2;
  WebPUpsamplers[3] = UpsampleBgraLinePair_SSE2;
  WebPUpsamplers[7] = UpsampleRgbaLinePair_SSE2;
  WebPUpsamplers[8] = UpsampleBgraLinePair_SSE2;
  WebPUpsamplers[0] = UpsampleRgbLinePair_SSE2;
  WebPUpsamplers[2] = UpsampleBgrLinePair_SSE2;
  WebPUpsamplers[4] = UpsampleArgbLinePair_SSE2;
  WebPUpsamplers[9] = UpsampleArgbLinePair_SSE2;
  WebPUpsamplers[6] = UpsampleRgb565LinePair_SSE2;
  WebPUpsamplers[5] = UpsampleRgba4444LinePair_SSE2;
  WebPUpsamplers[10] = UpsampleRgba4444LinePair_SSE2;
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void WebPInitUpsamplersSSE2(void) {
  WebPUpsamplers[MODE_RGBA] = UpsampleRgbaLinePair_SSE2;
  WebPUpsamplers[MODE_BGRA] = UpsampleBgraLinePair_SSE2;
  WebPUpsamplers[MODE_rgbA] = UpsampleRgbaLinePair_SSE2;
  WebPUpsamplers[MODE_bgrA] = UpsampleBgraLinePair_SSE2;
#if !defined(WEBP_REDUCE_CSP)
  WebPUpsamplers[MODE_RGB]  = UpsampleRgbLinePair_SSE2;
  WebPUpsamplers[MODE_BGR]  = UpsampleBgrLinePair_SSE2;
  WebPUpsamplers[MODE_ARGB] = UpsampleArgbLinePair_SSE2;
  WebPUpsamplers[MODE_Argb] = UpsampleArgbLinePair_SSE2;
  WebPUpsamplers[MODE_RGB_565] = UpsampleRgb565LinePair_SSE2;
  WebPUpsamplers[MODE_RGBA_4444] = UpsampleRgba4444LinePair_SSE2;
  WebPUpsamplers[MODE_rgbA_4444] = UpsampleRgba4444LinePair_SSE2;
#endif   // WEBP_REDUCE_CSP
}